

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptnum_tests.cpp
# Opt level: O2

void scriptnum_tests::RunCreate(int64_t *num)

{
  long lVar1;
  int iVar2;
  undefined1 **ppuVar3;
  size_t siglen;
  size_t siglen_00;
  size_t siglen_01;
  ulong uVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  check_type cVar7;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  long local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 local_a0 [8];
  bool local_98;
  undefined7 uStack_97;
  undefined1 *local_90;
  char **local_88;
  assertion_result local_80;
  undefined1 *local_68;
  undefined1 *local_60;
  CScriptNum scriptnum;
  CScriptNum scriptnum_1;
  CScriptNum10 bignum;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  scriptnum_1.m_value = *num;
  scriptnum.m_value = (int64_t)anon_var_dwarf_fbb176;
  ppuVar3 = &local_68;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2d;
  file.m_begin = (iterator)&scriptnum;
  bignum.m_value = scriptnum_1.m_value;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar3,msg);
  iVar2 = verify((EVP_PKEY_CTX *)&bignum,(uchar *)&scriptnum_1,siglen,(uchar *)ppuVar3,(size_t)in_R8
                );
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88 = &local_b0;
  local_b0 = "verify(bignum, scriptnum)";
  local_a8 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_b8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar7,(size_t)&local_c0,0x2d);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_a8 = "";
  ppuVar3 = &local_d0;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x2e;
  file_00.m_begin = (iterator)&local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar3,msg_00);
  local_100 = (undefined1 *)bignum;
  if (bignum.m_value < -0x7fffffff) {
    local_100 = (undefined1 *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_100) {
    local_100 = (undefined1 *)0x7fffffff;
  }
  local_110 = (char *)scriptnum_1;
  if (scriptnum_1.m_value < -0x7fffffff) {
    local_110 = (char *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_110) {
    local_110 = (char *)0x7fffffff;
  }
  iVar2 = verify((EVP_PKEY_CTX *)&local_100,(uchar *)&local_110,siglen_00,(uchar *)ppuVar3,
                 (size_t)pvVar5);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88 = &local_e0;
  local_e0 = "verify(CScriptNum10(bignum.getint()), CScriptNum(scriptnum.getint()))";
  local_d8 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_e8 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar7,(size_t)&local_f0,0x2e);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_d8 = "";
  ppuVar3 = &local_100;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  file_01.m_end = (iterator)0x2f;
  file_01.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar3,msg_01);
  local_130 = (undefined1 *)scriptnum_1;
  if (scriptnum_1.m_value < -0x7fffffff) {
    local_130 = (undefined1 *)0xffffffff80000000;
  }
  if (0x7ffffffe < (long)local_130) {
    local_130 = (undefined1 *)0x7fffffff;
  }
  local_150 = (char *)0xffffffff80000000;
  if (-0x80000000 < bignum.m_value) {
    local_150 = (char *)bignum;
  }
  if (0x7ffffffe < (long)local_150) {
    local_150 = (char *)0x7fffffff;
  }
  iVar2 = verify((EVP_PKEY_CTX *)&local_130,(uchar *)&local_150,siglen_01,(uchar *)ppuVar3,
                 (size_t)pvVar5);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_110 = "verify(CScriptNum10(scriptnum.getint()), CScriptNum(bignum.getint()))";
  local_108 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_110;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_118 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar7,(size_t)&local_120,0x2f);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_108 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x30;
  file_02.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  local_138 = (long)scriptnum_1;
  if (scriptnum_1.m_value < -0x7fffffff) {
    local_138 = -0x80000000;
  }
  if (0x7ffffffe < local_138) {
    local_138 = 0x7fffffff;
  }
  local_140 = 0xffffffff80000000;
  if (-0x80000000 < bignum.m_value) {
    local_140 = (size_t)bignum;
  }
  if (0x7ffffffe < (long)local_140) {
    local_140 = 0x7fffffff;
  }
  iVar2 = verify((EVP_PKEY_CTX *)&local_138,(uchar *)&local_140,local_140,
                 (uchar *)0xffffffff80000001,(size_t)pvVar5);
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar2,0);
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_150 = 
  "verify(CScriptNum10(CScriptNum10(scriptnum.getint()).getint()), CScriptNum(CScriptNum(bignum.getint()).getint()))"
  ;
  local_148 = "";
  local_98 = false;
  local_a0 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
  ;
  local_158 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_88 = &local_150;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_a0,1,0,WARN,_cVar7,(size_t)&local_160,0x30);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  scriptnum.m_value = *num;
  CScriptNum::serialize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,&scriptnum.m_value);
  uVar4 = CONCAT71(uStack_97,local_98) - (long)local_a0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
  if (uVar4 < 5) {
    CheckCreateVch(num);
  }
  else {
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar6;
    msg_03.m_begin = pvVar5;
    file_03.m_end = (iterator)0x99;
    file_03.m_begin = (iterator)&local_170;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_180,
               msg_03);
    CheckCreateVch(num);
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar6;
    msg_04.m_begin = pvVar5;
    file_04.m_end = (iterator)0x99;
    file_04.m_begin = (iterator)&local_190;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1a0,
               msg_04);
    local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
    local_80.m_message.px = (element_type *)0x0;
    local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_98 = false;
    local_a0 = (undefined1  [8])&PTR__lazy_ostream_0113e5b0;
    local_90 = boost::unit_test::lazy_ostream::inst;
    local_88 = (char **)0xc043e9;
    local_1b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scriptnum_tests.cpp"
    ;
    local_1a8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_80,(lazy_ostream *)local_a0,1,1,WARN,_cVar7,(size_t)&local_1b0,0x99);
    boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void RunCreate(const int64_t& num)
{
    CheckCreateInt(num);
    CScriptNum scriptnum(num);
    if (scriptnum.getvch().size() <= CScriptNum::nDefaultMaxNumSize)
        CheckCreateVch(num);
    else
    {
        BOOST_CHECK_THROW (CheckCreateVch(num), scriptnum10_error);
    }
}